

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-target.inc.c
# Opt level: O1

_Bool expand_vec_cmp_noinv
                (TCGContext_conflict9 *tcg_ctx,TCGType_conflict type,uint vece,TCGv_vec v0,
                TCGv_vec v1,TCGv_vec v2,TCGCond cond)

{
  ulong *puVar1;
  ulong uVar2;
  TCGCond TVar3;
  TCGTemp *pTVar4;
  ulong uVar5;
  TCGCond TVar6;
  TCGArg c;
  uintptr_t o_3;
  TCGv_vec r;
  uintptr_t o_1;
  TCGv_vec a;
  TCGCond TVar7;
  uintptr_t o_4;
  TCGv_vec r_00;
  uintptr_t o_2;
  bool bVar8;
  
  bVar8 = true;
  switch(cond) {
  case TCG_COND_LT:
  case TCG_COND_GE:
    TVar7 = cond;
    break;
  case TCG_COND_LTU:
    bVar8 = 2 < vece;
    TVar7 = 0x11;
    if (bVar8) {
      TVar7 = TCG_COND_LTU|TCG_COND_LT;
    }
    break;
  case TCG_COND_GEU:
    bVar8 = vece >= 3;
    TVar7 = (uint)(vece < 3) * 9 + (TCG_COND_LTU|TCG_COND_GE);
    break;
  default:
    g_assertion_message_expr
              ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/i386/tcg-target.inc.c"
               ,0xdbb,(char *)0x0);
  case TCG_COND_EQ:
  case TCG_COND_GT:
    TVar7 = TCG_COND_NEVER;
    break;
  case TCG_COND_NE:
  case TCG_COND_LE:
    TVar7 = TCG_COND_ALWAYS;
    break;
  case TCG_COND_LEU:
    bVar8 = vece >= 3;
    TVar7 = (uint)(vece < 3) * 3 + TCG_COND_GEU;
    break;
  case TCG_COND_GTU:
    bVar8 = vece >= 3;
    TVar7 = (uint)(vece < 3) * 5 + TCG_COND_LTU;
  }
  TVar6 = TVar7 & TCG_COND_ALWAYS ^ cond;
  TVar3 = TVar6 ^ TCG_COND_NE;
  a = v2;
  if ((TVar7 & TCG_COND_LT) == TCG_COND_NEVER) {
    TVar3 = TVar6;
    a = v1;
    v1 = v2;
  }
  if ((cond & (TCG_COND_LTU|TCG_COND_LT)) == TCG_COND_NEVER) {
    TVar3 = TVar6;
  }
  c = (TCGArg)TVar3;
  if (bVar8) {
    if ((TVar7 & TCG_COND_LTU) == TCG_COND_NEVER) {
      r = (TCGv_vec)0x0;
      r_00 = (TCGv_vec)0x0;
    }
    else {
      pTVar4 = tcg_temp_new_internal_tricore(tcg_ctx,type,false);
      r = (TCGv_vec)((long)pTVar4 - (long)tcg_ctx);
      pTVar4 = tcg_temp_new_internal_tricore(tcg_ctx,type,false);
      r_00 = (TCGv_vec)((long)pTVar4 - (long)tcg_ctx);
      tcg_gen_dupi_vec_tricore
                (tcg_ctx,vece,r_00,1L << ((char)(8 << ((byte)vece & 0x1f)) - 1U & 0x3f));
      tcg_gen_sub_vec_tricore(tcg_ctx,vece,r,a,r_00);
      tcg_gen_sub_vec_tricore(tcg_ctx,vece,r_00,v1,r_00);
      a = r;
      v1 = r_00;
      if ((TVar3 & TCG_COND_LTU) != TCG_COND_NEVER) {
        c = (TCGArg)(TVar3 ^ (TCG_COND_LTU|TCG_COND_LT));
      }
    }
  }
  else {
    pTVar4 = tcg_temp_new_internal_tricore(tcg_ctx,type,false);
    r = (TCGv_vec)((long)pTVar4 - (long)tcg_ctx);
    if ((TVar7 & TCG_COND_EQ) == TCG_COND_NEVER) {
      tcg_gen_umax_vec_tricore(tcg_ctx,vece,r,a,v1);
    }
    else {
      tcg_gen_umin_vec_tricore(tcg_ctx,vece,r,a,v1);
    }
    c = 8;
    r_00 = (TCGv_vec)0x0;
    v1 = r;
  }
  vec_gen_4_tricore(tcg_ctx,INDEX_op_cmp_vec,type,vece,(TCGArg)(v0 + (long)tcg_ctx),
                    (TCGArg)(a + (long)tcg_ctx),(TCGArg)(v1 + (long)tcg_ctx),c);
  if (r != (TCGv_vec)0x0) {
    uVar5 = ((long)(r + -0x388) >> 3) * 0x6db6db6db6db6db7;
    uVar2 = *(ulong *)(r + (long)&tcg_ctx->pool_cur);
    *(ulong *)(r + (long)&tcg_ctx->pool_cur) = uVar2 & 0xffffff5fffffffff;
    puVar1 = (ulong *)((long)tcg_ctx->free_temps[0].l +
                      (uVar5 >> 6) * 8 +
                      (ulong)((((uint)(uVar2 >> 0x26) & 1) * 5 + ((uint)(uVar2 >> 0x10) & 0xff)) *
                             0x40));
    *puVar1 = *puVar1 | 1L << ((byte)uVar5 & 0x3f);
    if (r_00 != (TCGv_vec)0x0) {
      uVar5 = ((long)(r_00 + -0x388) >> 3) * 0x6db6db6db6db6db7;
      uVar2 = *(ulong *)(r_00 + (long)&tcg_ctx->pool_cur);
      *(ulong *)(r_00 + (long)&tcg_ctx->pool_cur) = uVar2 & 0xffffff5fffffffff;
      puVar1 = (ulong *)((long)tcg_ctx->free_temps[0].l +
                        (uVar5 >> 6) * 8 +
                        (ulong)(((uint)((uVar2 & 0x4000000000) != 0) * 5 +
                                ((uint)(uVar2 >> 0x10) & 0xff)) * 0x40));
      *puVar1 = *puVar1 | 1L << ((byte)uVar5 & 0x3f);
    }
  }
  return SUB41(TVar7 & TCG_COND_ALWAYS,0);
}

Assistant:

static bool expand_vec_cmp_noinv(TCGContext *tcg_ctx, TCGType type, unsigned vece, TCGv_vec v0,
                                 TCGv_vec v1, TCGv_vec v2, TCGCond cond)
{
    enum {
        NEED_INV  = 1,
        NEED_SWAP = 2,
        NEED_BIAS = 4,
        NEED_UMIN = 8,
        NEED_UMAX = 16,
    };
    TCGv_vec t1, t2;
    uint8_t fixup = 0;

    switch (cond) {
    case TCG_COND_EQ:
    case TCG_COND_GT:
        fixup = 0;
        break;
    case TCG_COND_NE:
    case TCG_COND_LE:
        fixup = NEED_INV;
        break;
    case TCG_COND_LT:
        fixup = NEED_SWAP;
        break;
    case TCG_COND_GE:
        fixup = NEED_SWAP | NEED_INV;
        break;
    case TCG_COND_LEU:
        if (vece <= MO_32) {
            fixup = NEED_UMIN;
        } else {
            fixup = NEED_BIAS | NEED_INV;
        }
        break;
    case TCG_COND_GTU:
        if (vece <= MO_32) {
            fixup = NEED_UMIN | NEED_INV;
        } else {
            fixup = NEED_BIAS;
        }
        break;
    case TCG_COND_GEU:
        if (vece <= MO_32) {
            fixup = NEED_UMAX;
        } else {
            fixup = NEED_BIAS | NEED_SWAP | NEED_INV;
        }
        break;
    case TCG_COND_LTU:
        if (vece <= MO_32) {
            fixup = NEED_UMAX | NEED_INV;
        } else {
            fixup = NEED_BIAS | NEED_SWAP;
        }
        break;
    default:
        g_assert_not_reached();
    }

    if (fixup & NEED_INV) {
        cond = tcg_invert_cond(cond);
    }
    if (fixup & NEED_SWAP) {
        t1 = v1, v1 = v2, v2 = t1;
        cond = tcg_swap_cond(cond);
    }

    t1 = t2 = NULL;
    if (fixup & (NEED_UMIN | NEED_UMAX)) {
        t1 = tcg_temp_new_vec(tcg_ctx, type);
        if (fixup & NEED_UMIN) {
            tcg_gen_umin_vec(tcg_ctx, vece, t1, v1, v2);
        } else {
            tcg_gen_umax_vec(tcg_ctx, vece, t1, v1, v2);
        }
        v2 = t1;
        cond = TCG_COND_EQ;
    } else if (fixup & NEED_BIAS) {
        t1 = tcg_temp_new_vec(tcg_ctx, type);
        t2 = tcg_temp_new_vec(tcg_ctx, type);
        tcg_gen_dupi_vec(tcg_ctx, vece, t2, 1ull << ((8 << vece) - 1));
        tcg_gen_sub_vec(tcg_ctx, vece, t1, v1, t2);
        tcg_gen_sub_vec(tcg_ctx, vece, t2, v2, t2);
        v1 = t1;
        v2 = t2;
        cond = tcg_signed_cond(cond);
    }

    tcg_debug_assert(cond == TCG_COND_EQ || cond == TCG_COND_GT);
    /* Expand directly; do not recurse.  */
    vec_gen_4(tcg_ctx, INDEX_op_cmp_vec, type, vece,
              tcgv_vec_arg(tcg_ctx, v0), tcgv_vec_arg(tcg_ctx, v1), tcgv_vec_arg(tcg_ctx, v2), cond);

    if (t1) {
        tcg_temp_free_vec(tcg_ctx, t1);
        if (t2) {
            tcg_temp_free_vec(tcg_ctx, t2);
        }
    }
    return fixup & NEED_INV;
}